

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O1

bool A_RaiseMobj(AActor *actor,double speed)

{
  bool bVar1;
  double dVar2;
  
  bVar1 = true;
  if (0.0 < actor->Floorclip) {
    dVar2 = actor->Floorclip - speed;
    actor->Floorclip = dVar2;
    if (dVar2 <= 0.0) {
      actor->Floorclip = 0.0;
      return bVar1;
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool A_RaiseMobj (AActor *actor, double speed)
{
	bool done = true;

	// Raise a mobj from the ground
	if (actor->Floorclip > 0)
	{
		actor->Floorclip -= speed;
		if (actor->Floorclip <= 0)
		{
			actor->Floorclip = 0;
			done = true;
		}
		else
		{
			done = false;
		}
	}
	return done;		// Reached target height
}